

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeGapGrayCode.cpp
# Opt level: O2

void __thiscall LargeGapGrayCode::printStatisticsHeader(LargeGapGrayCode *this)

{
  ostream *poVar1;
  
  *(undefined8 *)(__cxa_rethrow + *(long *)(std::cout + -0x18)) = 5;
  poVar1 = std::operator<<((ostream *)&std::cout,"n");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
  poVar1 = std::operator<<(poVar1,"Method");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
  poVar1 = std::operator<<(poVar1,"MinGap");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
  poVar1 = std::operator<<(poVar1,"MaxGap");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
  poVar1 = std::operator<<(poVar1,"MinCount");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xc;
  poVar1 = std::operator<<(poVar1,"MaxCount");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 0xe;
  poVar1 = std::operator<<(poVar1,"GapVariance");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "------------------------------------------------------------------------------------"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void LargeGapGrayCode::printStatisticsHeader()
{
	std::cout 	<< std::setw(5) << "n"
			<< std::setw(12) << "Method"
			<< std::setw(12) << "MinGap"
			<< std::setw(12) << "MaxGap"
			<< std::setw(12) << "MinCount"
			<< std::setw(12) << "MaxCount"
			<< std::setw(14) << "GapVariance" << std::endl;
	std::cout << "------------------------------------------------------------------------------------" << std::endl;
}